

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O2

ssize_t amqp_ssl_socket_writev(void *base,iovec *iov,int iovcnt)

{
  ulong uVar1;
  void *__ptr;
  ssize_t sVar2;
  ulong __size;
  ulong uVar3;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)iovcnt;
  if (iovcnt < 1) {
    uVar3 = uVar1;
  }
  __size = 0;
  for (; uVar3 * 0x10 != uVar1; uVar1 = uVar1 + 0x10) {
    __size = __size + *(long *)((long)&iov->iov_len + uVar1);
  }
  __ptr = *(void **)((long)base + 0x20);
  if (*(ulong *)((long)base + 0x28) < __size) {
    __ptr = realloc(__ptr,__size);
    *(void **)((long)base + 0x20) = __ptr;
    if (__ptr == (void *)0x0) {
      *(undefined8 *)((long)base + 0x28) = 0;
      return -1;
    }
    *(ulong *)((long)base + 0x28) = __size;
  }
  for (uVar1 = 0; uVar3 * 0x10 != uVar1; uVar1 = uVar1 + 0x10) {
    memcpy(__ptr,*(void **)((long)&iov->iov_base + uVar1),*(size_t *)((long)&iov->iov_len + uVar1));
    __ptr = (void *)((long)__ptr + *(long *)((long)&iov->iov_len + uVar1));
  }
  sVar2 = amqp_ssl_socket_send(base,*(void **)((long)base + 0x20),__size);
  return sVar2;
}

Assistant:

static ssize_t
amqp_ssl_socket_writev(void *base,
                       struct iovec *iov,
                       int iovcnt)
{
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  ssize_t ret = -1;
  char *bufferp;
  size_t bytes;
  int i;
  bytes = 0;
  for (i = 0; i < iovcnt; ++i) {
    bytes += iov[i].iov_len;
  }
  if (self->length < bytes) {
    self->buffer = realloc(self->buffer, bytes);
    if (!self->buffer) {
      self->length = 0;
      ret = AMQP_STATUS_NO_MEMORY;
      goto exit;
    }
    self->length = bytes;
  }
  bufferp = self->buffer;
  for (i = 0; i < iovcnt; ++i) {
    memcpy(bufferp, iov[i].iov_base, iov[i].iov_len);
    bufferp += iov[i].iov_len;
  }
  ret = amqp_ssl_socket_send(self, self->buffer, bytes);
exit:
  return ret;
}